

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiff_io.cc
# Opt level: O3

void __thiscall gimage::TIFFImageIO::save(TIFFImageIO *this,ImageU8 *image,char *name)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  uint uVar3;
  uint uVar4;
  undefined4 uVar5;
  int iVar6;
  long lVar7;
  long lVar8;
  IOException *pIVar9;
  ulong uVar10;
  long lVar11;
  pointer puVar12;
  long lVar13;
  ulong uVar14;
  vector<unsigned_char,_std::allocator<unsigned_char>_> line;
  allocator local_81;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_40;
  
  lVar7 = TIFFOpen(name,"w");
  if (lVar7 == 0) {
    pIVar9 = (IOException *)__cxa_allocate_exception(0x28);
    std::__cxx11::string::string((string *)&local_80,name,(allocator *)&local_40);
    std::operator+(&local_60,"Cannot store image: ",&local_80);
    gutil::IOException::IOException(pIVar9,&local_60);
    __cxa_throw(pIVar9,&gutil::IOException::typeinfo,gutil::Exception::~Exception);
  }
  TIFFSetField(lVar7,0x100,(int)image->width);
  TIFFSetField(lVar7,0x101,(int)image->height);
  TIFFSetField(lVar7,0x115,(short)image->depth);
  TIFFSetField(lVar7,0x102,8);
  TIFFSetField(lVar7,0x153,1);
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (long)image->depth * image->width;
  auVar2 = ZEXT816(0) << 0x40 | ZEXT816(0x2000);
  uVar4 = SUB164(auVar2 / auVar1,0);
  if (uVar4 < 2) {
    uVar4 = 1;
  }
  uVar3 = (uint)image->height;
  if ((int)uVar4 < (int)uVar3) {
    uVar3 = uVar4;
  }
  uVar5 = TIFFDefaultStripSize(lVar7,uVar3,SUB168(auVar2 % auVar1,0));
  TIFFSetField(lVar7,0x116,uVar5);
  TIFFSetField(lVar7,0x112,1);
  TIFFSetField(lVar7,0x11c,1);
  TIFFSetField(lVar7,0x106,(image->depth - 3U < 2) + '\x01');
  if ((long)image->depth == 1) {
    if (0 < image->height) {
      uVar14 = 0;
      do {
        iVar6 = TIFFWriteScanline(lVar7,(*image->img)[uVar14],uVar14 & 0xffffffff,0);
        if (iVar6 < 0) {
          TIFFClose(lVar7);
          pIVar9 = (IOException *)__cxa_allocate_exception(0x28);
          std::__cxx11::string::string((string *)&local_80,name,(allocator *)&local_40);
          std::operator+(&local_60,"Cannot write image data: ",&local_80);
          gutil::IOException::IOException(pIVar9,&local_60);
          __cxa_throw(pIVar9,&gutil::IOException::typeinfo,gutil::Exception::~Exception);
        }
        uVar14 = uVar14 + 1;
      } while ((long)uVar14 < image->height);
    }
  }
  else {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              (&local_40,(long)image->depth * image->width,(allocator_type *)&local_60);
    if (0 < image->height) {
      uVar14 = 0;
      do {
        lVar11 = image->width;
        if (0 < lVar11) {
          uVar10 = (ulong)(uint)image->depth;
          lVar8 = 0;
          puVar12 = local_40.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          do {
            if (0 < (int)uVar10) {
              lVar13 = 0;
              do {
                puVar12[lVar13] = image->img[lVar13][uVar14][lVar8];
                lVar13 = lVar13 + 1;
                uVar10 = (ulong)image->depth;
              } while (lVar13 < (long)uVar10);
              lVar11 = image->width;
              puVar12 = puVar12 + lVar13;
            }
            lVar8 = lVar8 + 1;
          } while (lVar8 < lVar11);
        }
        iVar6 = TIFFWriteScanline(lVar7,local_40.
                                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                        ._M_impl.super__Vector_impl_data._M_start,
                                  uVar14 & 0xffffffff,0);
        if (iVar6 < 0) {
          TIFFClose(lVar7);
          pIVar9 = (IOException *)__cxa_allocate_exception(0x28);
          std::__cxx11::string::string((string *)&local_80,name,&local_81);
          std::operator+(&local_60,"Cannot write image data: ",&local_80);
          gutil::IOException::IOException(pIVar9,&local_60);
          __cxa_throw(pIVar9,&gutil::IOException::typeinfo,gutil::Exception::~Exception);
        }
        uVar14 = uVar14 + 1;
      } while ((long)uVar14 < image->height);
    }
    if (local_40.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_40.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
  }
  TIFFClose(lVar7);
  return;
}

Assistant:

void TIFFImageIO::save(const ImageU8 &image, const char *name) const
{
  saveInternal(image, name);
}